

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-swap8.h
# Opt level: O0

void swap8(void *value)

{
  uchar *v;
  void *value_local;
  
  *(byte *)value = *value ^ *(byte *)((long)value + 7);
  *(byte *)((long)value + 7) = *value ^ *(byte *)((long)value + 7);
  *(byte *)value = *value ^ *(byte *)((long)value + 7);
  *(byte *)((long)value + 1) = *(byte *)((long)value + 1) ^ *(byte *)((long)value + 6);
  *(byte *)((long)value + 6) = *(byte *)((long)value + 1) ^ *(byte *)((long)value + 6);
  *(byte *)((long)value + 1) = *(byte *)((long)value + 1) ^ *(byte *)((long)value + 6);
  *(byte *)((long)value + 2) = *(byte *)((long)value + 2) ^ *(byte *)((long)value + 5);
  *(byte *)((long)value + 5) = *(byte *)((long)value + 2) ^ *(byte *)((long)value + 5);
  *(byte *)((long)value + 2) = *(byte *)((long)value + 2) ^ *(byte *)((long)value + 5);
  *(byte *)((long)value + 3) = *(byte *)((long)value + 3) ^ *(byte *)((long)value + 4);
  *(byte *)((long)value + 4) = *(byte *)((long)value + 3) ^ *(byte *)((long)value + 4);
  *(byte *)((long)value + 3) = *(byte *)((long)value + 3) ^ *(byte *)((long)value + 4);
  return;
}

Assistant:

static void swap8(void *value)
{
    unsigned char *v = (unsigned char *)value;

    /* use XOR swap algorithm to swap bytes 0/7, 1/6, 2/5, and 3/4 */
    v[0] = v[0] ^ v[7];
    v[7] = v[0] ^ v[7];
    v[0] = v[0] ^ v[7];
    v[1] = v[1] ^ v[6];
    v[6] = v[1] ^ v[6];
    v[1] = v[1] ^ v[6];
    v[2] = v[2] ^ v[5];
    v[5] = v[2] ^ v[5];
    v[2] = v[2] ^ v[5];
    v[3] = v[3] ^ v[4];
    v[4] = v[3] ^ v[4];
    v[3] = v[3] ^ v[4];
}